

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.cc
# Opt level: O0

uint64 __thiscall google::protobuf::internal::SerialArena::SpaceUsed(SerialArena *this)

{
  char *pcVar1;
  char *pcVar2;
  size_t sVar3;
  Block *local_20;
  Block *b;
  uint64 space_used;
  SerialArena *this_local;
  
  pcVar1 = this->ptr_;
  pcVar2 = Block::Pointer(this->head_,0x18);
  b = (Block *)(pcVar1 + -(long)pcVar2);
  for (local_20 = Block::next(this->head_); local_20 != (Block *)0x0;
      local_20 = Block::next(local_20)) {
    sVar3 = Block::pos(local_20);
    b = (Block *)((long)&b[-1].next_and_bits_ + sVar3);
  }
  return (uint64)(b + -3);
}

Assistant:

uint64 SerialArena::SpaceUsed() const {
  // Get current block's size from ptr_ (since we can't trust head_->pos().
  uint64 space_used = ptr_ - head_->Pointer(kBlockHeaderSize);
  // Get subsequent block size from b->pos().
  for (Block* b = head_->next(); b; b = b->next()) {
    space_used += (b->pos() - kBlockHeaderSize);
  }
  // Remove the overhead of the SerialArena itself.
  space_used -= ArenaImpl::kSerialArenaSize;
  return space_used;
}